

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O2

void __thiscall
soul::ArrayWithPreallocation<soul::pool_ref<soul::AST::Function>,_4UL>::reserve
          (ArrayWithPreallocation<soul::pool_ref<soul::AST::Function>,_4UL> *this,size_t minSize)

{
  pool_ref<soul::AST::Function> *ppVar1;
  ulong uVar2;
  pool_ref<soul::AST::Function> *ppVar3;
  size_t i;
  ulong uVar4;
  ulong uVar5;
  
  if (this->numAllocated < minSize) {
    uVar5 = minSize + 0xf & 0xfffffffffffffff0;
    if (uVar5 != 0) {
      ppVar3 = (pool_ref<soul::AST::Function> *)operator_new__(uVar5 * 8);
      ppVar1 = this->items;
      uVar2 = this->numActive;
      for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
        ppVar3[uVar4].object = ppVar1[uVar4].object;
      }
      freeIfHeapAllocated(this);
      this->items = ppVar3;
    }
    this->numAllocated = uVar5;
  }
  return;
}

Assistant:

void reserve (size_t minSize)
    {
        if (minSize > numAllocated)
        {
            minSize = getAlignedSize<16> (minSize);

            if (minSize > preallocatedItems)
            {
                auto* newObjects = reinterpret_cast<Item*> (new char[minSize * sizeof (Item)]);

                for (size_t i = 0; i < numActive; ++i)
                {
                    new (newObjects + i) Item (std::move (items[i]));
                    items[i].~Item();
                }

                freeIfHeapAllocated();
                items = newObjects;
            }

            numAllocated = minSize;
        }
    }